

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

_Bool resolve_params(SolverParams *params,SolverDescriptor *desc,SolverTypedParams *out)

{
  TypedParam *pTVar1;
  FILE *pFVar2;
  long lVar3;
  _Bool _Var4;
  int iVar5;
  SolverTypedParamsEntry *pSVar6;
  char *pcVar7;
  ulong uVar8;
  SolverDescriptor *pSVar9;
  SolverDescriptor *pSVar10;
  ParamType type;
  char *__s2;
  char *val;
  uint uVar11;
  TypedParam local_58;
  SolverDescriptor *local_48;
  long local_40;
  SolverDescriptor *local_38;
  
  if (out->entries != (SolverTypedParamsEntry *)0x0) {
    stbds_hmfree_func(out->entries + -1,0x18);
  }
  out->entries = (SolverTypedParamsEntry *)0x0;
  __s2 = desc[1].name;
  if (__s2 != (char *)0x0) {
    pSVar9 = desc + 1;
    local_40 = 0;
    pSVar10 = pSVar9;
    local_48 = pSVar9;
    do {
      uVar11 = params->num_params;
      if ((int)uVar11 < 1) {
LAB_00104b46:
        val = pSVar9[2].name;
        local_58.field_2.dval = 0.0;
        type = *(ParamType *)&pSVar9[1].name;
        local_58._0_8_ = (ulong)type << 0x20;
        if (val != (char *)0x0) goto LAB_00104bd0;
      }
      else {
        if (0xff < uVar11) {
          uVar11 = 0x100;
        }
        uVar8 = 0;
        val = (char *)0x0;
        local_38 = pSVar9;
        do {
          pcVar7 = *(char **)((long)&params->params[0].name + uVar8);
          iVar5 = strcmp(pcVar7,__s2);
          if (iVar5 == 0) {
            if (val != (char *)0x0) {
              fprintf(_stderr,"ERROR: parameter `%s` specified twice or more.\n",pcVar7);
              goto LAB_00104c48;
            }
            val = *(char **)((long)&params->params[0].value + uVar8);
          }
          uVar8 = uVar8 + 0x10;
        } while (uVar11 << 4 != uVar8);
        pSVar9 = local_38;
        pSVar10 = local_48;
        if (val == (char *)0x0) goto LAB_00104b46;
        type = *(ParamType *)&local_38[1].name;
        local_58._0_8_ = (ulong)type << 0x20;
LAB_00104bd0:
        pFVar2 = _stderr;
        local_58.field_2.dval = 0.0;
        local_58.count = 1;
        pcVar7 = param_type_as_str(type);
        fprintf(pFVar2,"%s :: Setting `%s` (%s) to value `%s`\n","resolve_params",__s2,pcVar7,val);
        _Var4 = parse_solver_param_val(&local_58,val,*(ParamType *)&pSVar9[1].name);
        pFVar2 = _stderr;
        __s2 = pSVar9->name;
        pSVar10 = local_48;
        if (!_Var4) {
          pcVar7 = param_type_as_str(*(ParamType *)&pSVar9[1].name);
          fprintf(pFVar2,"ERROR: Failed to parse param `%s=%s` required as a %s\n",__s2,val,pcVar7);
LAB_00104c48:
          if (out->entries != (SolverTypedParamsEntry *)0x0) {
            stbds_hmfree_func(out->entries + -1,0x18);
          }
          out->entries = (SolverTypedParamsEntry *)0x0;
          return false;
        }
      }
      lVar3 = local_40;
      pSVar6 = (SolverTypedParamsEntry *)stbds_hmput_key(out->entries,0x18,__s2,8,1);
      out->entries = pSVar6;
      pTVar1 = &pSVar6[pSVar6[-2].value.field_2.sizeval].value;
      pTVar1->count = local_58.count;
      pTVar1->type = local_58.type;
      (pTVar1->field_2).dval = (double)local_58.field_2;
      local_40 = lVar3 + 1;
      pSVar9 = pSVar10 + local_40 * 4;
      __s2 = pSVar10[local_40 * 4].name;
    } while (__s2 != (char *)0x0);
  }
  return true;
}

Assistant:

bool resolve_params(const SolverParams *params, const SolverDescriptor *desc,
                    SolverTypedParams *out) {
    solver_typed_params_destroy(out);
    bool result = true;

    for (int32_t di = 0; desc->params[di].name != 0; di++) {
        const char *value = NULL;
        for (int32_t pi = 0;
             pi < MIN(MAX_NUM_SOLVER_PARAMS, params->num_params); pi++) {
            if (0 == strcmp(params->params[pi].name, desc->params[di].name)) {
                if (value) {
                    fprintf(stderr,
                            "ERROR: parameter `%s` specified twice or more.\n",
                            params->params[pi].name);
                    result = false;
                    goto terminate;
                }
                value = params->params[pi].value;
            }
        }

        // If the user didn't specify any value get the default value from the
        // descriptor
        if (!value) {
            value = desc->params[di].default_value;
        }

        // NOTE:
        // The descriptor may not contain a default_value: therefore
        // `value` may still be NULL
        TypedParam t = {0};
        t.type = desc->params[di].type;

        if (!value) {
            t.count = 0;
        } else {
            t.count = 1;

            fprintf(stderr, "%s :: Setting `%s` (%s) to value `%s`\n", __func__,
                    desc->params[di].name,
                    param_type_as_str(desc->params[di].type), value);

            if (!parse_solver_param_val(&t, value, desc->params[di].type)) {
                fprintf(
                    stderr,
                    "ERROR: Failed to parse param `%s=%s` required as a %s\n",
                    desc->params[di].name, value,
                    param_type_as_str(desc->params[di].type));
                result = false;
                goto terminate;
            }
        }

        shput(out->entries, desc->params[di].name, t);
    }

terminate:
    if (!result) {
        solver_typed_params_destroy(out);
    }
    return result;
}